

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfZip.cpp
# Opt level: O1

int __thiscall Imf_3_2::Zip::compress(Zip *this,char *raw,int rawSize,char *compressed)

{
  char *pcVar1;
  char cVar2;
  int in_EAX;
  int iVar3;
  undefined8 uVar4;
  BaseExc *this_00;
  char *pcVar5;
  char cVar6;
  long lVar7;
  size_t outSize;
  int local_28 [2];
  
  lVar7 = (long)rawSize;
  if (0 < rawSize) {
    pcVar1 = raw + lVar7;
    pcVar5 = this->_tmpBuffer;
    do {
      *pcVar5 = *raw;
      if (pcVar1 <= raw + 1) break;
      pcVar5[rawSize + 1U >> 1] = raw[1];
      pcVar5 = pcVar5 + 1;
      raw = raw + 2;
    } while (raw < pcVar1);
  }
  if (1 < rawSize) {
    pcVar1 = this->_tmpBuffer;
    pcVar5 = pcVar1 + 1;
    cVar6 = *pcVar1;
    do {
      cVar2 = *pcVar5;
      *pcVar5 = (cVar2 - cVar6) + -0x80;
      pcVar5 = pcVar5 + 1;
      cVar6 = cVar2;
    } while (pcVar5 < pcVar1 + lVar7);
  }
  iVar3 = this->_zipLevel;
  pcVar1 = this->_tmpBuffer;
  local_28[0] = in_EAX;
  uVar4 = exr_compress_max_buffer_size(this->_maxRawSize);
  iVar3 = exr_compress_buffer(iVar3,pcVar1,lVar7,compressed,uVar4,local_28);
  if (iVar3 == 0) {
    return local_28[0];
  }
  this_00 = (BaseExc *)__cxa_allocate_exception(0x48);
  Iex_3_2::BaseExc::BaseExc(this_00,"Data compression failed.");
  __cxa_throw(this_00,&Iex_3_2::BaseExc::typeinfo,Iex_3_2::BaseExc::~BaseExc);
}

Assistant:

int
Zip::compress (const char* raw, int rawSize, char* compressed)
{
    //
    // Reorder the pixel data.
    //

    {
        char*       t1   = _tmpBuffer;
        char*       t2   = _tmpBuffer + (rawSize + 1) / 2;
        const char* stop = raw + rawSize;

        while (true)
        {
            if (raw < stop)
                *(t1++) = *(raw++);
            else
                break;

            if (raw < stop)
                *(t2++) = *(raw++);
            else
                break;
        }
    }

    //
    // Predictor.
    //

    {
        unsigned char* t    = (unsigned char*) _tmpBuffer + 1;
        unsigned char* stop = (unsigned char*) _tmpBuffer + rawSize;
        int            p    = t[-1];

        while (t < stop)
        {
            int d = int (t[0]) - p + (128 + 256);
            p     = t[0];
            t[0]  = d;
            ++t;
        }
    }

    //
    // Compress the data using zlib
    //
    size_t outSize;
    if (EXR_ERR_SUCCESS != exr_compress_buffer (
            _zipLevel,
            _tmpBuffer,
            rawSize,
            compressed,
            maxCompressedSize (),
            &outSize))
    {
        throw IEX_NAMESPACE::BaseExc ("Data compression failed.");
    }

    return outSize;
}